

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# types.cpp
# Opt level: O0

Variable __thiscall
LiteScript::CreateNamespace(LiteScript *this,Memory *memory,int count,char **names,Variable *values)

{
  Object *this_00;
  Namespace *this_01;
  uint *extraout_RDX;
  uint *puVar1;
  uint *extraout_RDX_00;
  Variable VVar2;
  uint local_50;
  uint sz;
  uint i;
  Namespace *n;
  Variable *values_local;
  char **names_local;
  int count_local;
  Memory *memory_local;
  Variable *v;
  
  Memory::Create((Memory *)this,(Type *)memory);
  this_00 = Variable::operator->((Variable *)this);
  this_01 = Object::GetData<LiteScript::Namespace>(this_00);
  puVar1 = extraout_RDX;
  for (local_50 = 0; local_50 < (uint)count; local_50 = local_50 + 1) {
    Namespace::DefineVariable(this_01,names[local_50],values + local_50);
    puVar1 = extraout_RDX_00;
  }
  VVar2.nb_ref = puVar1;
  VVar2.obj = (Object *)this;
  return VVar2;
}

Assistant:

LiteScript::Variable LiteScript::CreateNamespace(Memory &memory, int count, const char **names, const Variable *values) {
    Variable v = memory.Create(Type::NAMESPACE);
    Namespace& n = v->GetData<Namespace>();
    for (unsigned int i = 0, sz = (unsigned int)count; i < sz; i++)
        n.DefineVariable(names[i], values[i]);
    return v;
}